

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::ExceptionImpl::~ExceptionImpl(ExceptionImpl *this)

{
  ExceptionImpl *this_local;
  
  *(undefined ***)this = &PTR__ExceptionImpl_002e35f8;
  String::~String(&this->whatBuffer);
  std::exception::~exception(&this->super_exception);
  Exception::~Exception(&this->super_Exception);
  return;
}

Assistant:

ExceptionImpl(const ExceptionImpl& other): Exception(other) {
    // No need to copy whatBuffer since it's just to hold the return value of what().
  }